

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeText.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__s;
  long *__s_00;
  bool bVar2;
  int iVar3;
  char *incomingText;
  size_t sVar4;
  pointer psVar5;
  int *piVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  char *translatedString;
  cmatch digits;
  string remainingIncomingString;
  regex digitPattern;
  decodeTextUtil textDecoderUtilInstance;
  int lockParameters [4];
  char *local_100;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_f8;
  char *local_d8;
  undefined8 local_d0;
  char local_c8;
  undefined7 uStack_c7;
  long *local_b8;
  char *local_b0;
  long local_a8 [2];
  char *local_98;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_90;
  decodeTextUtil local_70;
  int local_48 [6];
  
  if (argc == 2) {
    do {
      iVar3 = getopt_long(2,argv,"h",longOpts);
      if (iVar3 < 0) {
        pcVar1 = argv[1];
        incomingText = (char *)malloc(2);
        local_100 = (char *)0x0;
        local_48[0] = 0x70f;
        local_48[1] = 0xb0e9;
        local_48[2] = 0x34536;
        local_48[3] = 0;
        decodeTextUtil::decodeTextUtil(&local_70,local_48,"encoder");
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&local_90," 0*x*[0-9a-fA-F]{2}",0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,pcVar1,(allocator<char> *)&local_f8);
        local_f8.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_f8._M_begin = (char *)0x0;
        local_f8.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar9 = 0;
        goto LAB_00104b6f;
      }
      if (iVar3 == 1) {
        main_cold_2();
        return -2;
      }
    } while (iVar3 != 0x68);
    main_cold_3();
  }
  else {
    main_cold_1();
  }
  return -2;
LAB_00104b6f:
  __s_00 = local_b8;
  sVar4 = strlen((char *)local_b8);
  bVar2 = std::__detail::
          __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                    ((char *)__s_00,(char *)((long)__s_00 + sVar4),&local_f8,&local_90,0);
  if (!bVar2) {
    decodeTextUtil::translate(&local_70,incomingText,&local_100,(int)lVar9);
    fprintf(_stdout,"%s\n",local_100);
    free(local_100);
    free(incomingText);
    if (local_f8.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_90);
    decodeTextUtil::~decodeTextUtil(&local_70);
    return 0;
  }
  psVar5 = local_f8.
           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           .
           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_f8.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x48) {
    psVar5 = local_f8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -3;
  }
  if (local_f8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_f8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    psVar5 = local_f8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -3;
  }
  local_d8 = &local_c8;
  if (psVar5->matched == true) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,(psVar5->super_pair<const_char_*,_const_char_*>).first,
               (psVar5->super_pair<const_char_*,_const_char_*>).second);
  }
  else {
    local_d0 = 0;
    local_c8 = '\0';
  }
  pcVar1 = local_d8;
  piVar6 = __errno_location();
  iVar3 = *piVar6;
  *piVar6 = 0;
  lVar7 = strtol(pcVar1,&local_98,0x10);
  if (local_98 == pcVar1) {
    std::__throw_invalid_argument("stoi");
LAB_00104d97:
    uVar8 = std::__throw_out_of_range("stoi");
    if (local_f8.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_90);
    decodeTextUtil::~decodeTextUtil(&local_70);
    _Unwind_Resume(uVar8);
  }
  if (((int)lVar7 != lVar7) || (*piVar6 == 0x22)) goto LAB_00104d97;
  if (*piVar6 == 0) {
    *piVar6 = iVar3;
  }
  incomingText[lVar9] = (char)lVar7;
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  pcVar1 = local_b0;
  incomingText[lVar9 + 1] = '\0';
  psVar5 = local_f8.
           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           .
           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_f8.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x48) {
    psVar5 = local_f8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -3;
  }
  if (local_f8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_f8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    psVar5 = local_f8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -3;
  }
  __s = (psVar5->super_pair<const_char_*,_const_char_*>).second;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_b8,0,pcVar1,(ulong)__s);
  incomingText = (char *)realloc(incomingText,lVar9 + 3);
  lVar9 = lVar9 + 1;
  goto LAB_00104b6f;
}

Assistant:

int main(int argc, char *argv[]) {
  int c;

  if (argc != 2) {
    fprintf(stderr, USAGE_STR, argv[0]);
    return -2;
  }

  while ((c = getopt_long(argc, argv, "h", longOpts, NULL)) >= 0) {
    switch (c) {
      case 'h': {
        fprintf(stderr, "Text Decode VERSION %s\n", STR_VALUE(decodeText_VERSION_NUMBER));
        fprintf(stderr, USAGE_STR, argv[0]);
        return -2;
      }
      case 1: {
        fprintf(stderr, "Text Decode VERSION %s\n", STR_VALUE(decodeText_VERSION_NUMBER));
        fprintf(stderr, USAGE_STR, argv[0]);
        return -2;
      }
      default:
        break;
    }
  }

  const char * incomingString = argv[1];
  char * incomingBytes = reinterpret_cast<char *>(malloc(2));

  char * translatedString = 0;

  int lockParameters[] = {1807, 45289, 214326, 0};
  const char * names[] = {"encoder", 0};

  decodeTextUtil textDecoderUtilInstance(lockParameters, *names);

  std::regex digitPattern(" 0*x*[0-9a-fA-F]{2}");
  std::string remainingIncomingString = incomingString;
  std::cmatch digits;
  int index = 0;
  bool none = false;
  do {
    const char * remainingIncoming = remainingIncomingString.c_str();
    if (std::regex_search(remainingIncoming, digits, digitPattern)) {
      incomingBytes[index] = std::stoi(digits[0], 0, 16);
      incomingBytes[index+1] = 0;
      remainingIncomingString = digits[0].second;
      index++;
      incomingBytes = reinterpret_cast<char *>(realloc(incomingBytes, 2 + index));
    } else {
      none = true;
    }
  } while (!none);
  int size = index;
  size = textDecoderUtilInstance.translate(incomingBytes, &translatedString, size);

  fprintf(stdout, "%s\n", translatedString);

  free(translatedString);
  free(incomingBytes);

  return 0;
}